

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  Type type;
  key_type line;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  AssertionResult *assertion_result;
  key_type *in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  hasher *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff910;
  Type in_stack_fffffffffffff91c;
  AssertHelper *in_stack_fffffffffffff920;
  undefined2 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff952;
  value_type in_stack_fffffffffffff95c;
  uint i_00;
  AssertHelper *this_02;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff990;
  AssertionResult local_638;
  string local_628 [48];
  key_type local_5f8;
  undefined1 local_5f1;
  AssertionResult local_5f0;
  value_type *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  AssertionResult local_570;
  string local_560 [48];
  key_type local_530;
  undefined1 local_529;
  AssertionResult local_528 [2];
  key_type local_504;
  value_type local_4ac;
  AssertionResult local_4a8 [2];
  key_type local_484;
  value_type local_42c;
  AssertionResult local_428;
  string local_418 [55];
  undefined1 local_3e1;
  AssertionResult local_3e0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3d0 [2];
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_3a8;
  string local_310 [55];
  undefined1 local_2d9;
  AssertionResult local_2d8;
  stringstream local_2c8 [392];
  key_type local_140;
  key_type local_13c;
  value_type local_e0;
  int local_dc;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  AssertHelper local_ac;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a0;
  
  bVar1 = google::
          HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 4));
  if (bVar1) {
    this_02 = &local_ac;
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    assertion_result = (AssertionResult *)(ulong)i_00;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,i_00,(int *)assertion_result)
    ;
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff910,
               CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900,
               (key_equal *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (allocator_type *)in_stack_fffffffffffff8f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_d8 = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff8f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    for (local_dc = 1; local_dc < 100; local_dc = local_dc + 1) {
      in_stack_fffffffffffff95c =
           HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
      local_e0 = in_stack_fffffffffffff95c;
      google::
      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28);
    }
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_13c = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff8f0,
            (key_type *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_140 = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff8f0,
            (key_type *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    std::__cxx11::stringstream::stringstream(local_2c8);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      (&local_a0,local_2c8);
    local_2d9 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8f0,
               (bool *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (type *)0xf98de3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff920);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffff95c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffff952,
                                                                in_stack_fffffffffffff950))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                 (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string(local_310);
      testing::Message::~Message((Message *)0xf98ebf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf98f56);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff910,
               CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900,
               (key_equal *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (allocator_type *)in_stack_fffffffffffff8f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3d0);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      (&local_3a8,local_2c8);
    local_3e1 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8f0,
               (bool *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (type *)0xf99004);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff920);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffff95c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff950))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                 (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string(local_418);
      testing::Message::~Message((Message *)0xf99118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf991af);
    local_42c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_484 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff990,in_RDI);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf99221);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (char *)in_stack_fffffffffffff900,
               (int *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (int *)in_stack_fffffffffffff8f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff920);
      testing::AssertionResult::failure_message((AssertionResult *)0xf9928f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                 (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      testing::Message::~Message((Message *)0xf992ec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9935d);
    local_4ac = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_504 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff990,in_RDI);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf993cf);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (char *)in_stack_fffffffffffff900,
               (int *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (int *)in_stack_fffffffffffff8f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff920);
      testing::AssertionResult::failure_message((AssertionResult *)0xf9943d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff920,in_stack_fffffffffffff91c,
                 (char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      testing::Message::~Message((Message *)0xf9949a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9950b);
    local_530 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff8f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    local_529 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8f0,
               (bool *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (type *)0xf99573);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffff95c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff950))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffff91c,(char *)in_stack_fffffffffffff910,
                 in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string(local_560);
      testing::Message::~Message((Message *)0xf99648);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf996df);
    type = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff990,in_RDI);
    google::
    sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf99751);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
               (char *)in_stack_fffffffffffff900,
               (int *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (int *)in_stack_fffffffffffff8f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffff910 =
           (HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf997bf);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                 (char *)in_stack_fffffffffffff900);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      testing::Message::~Message((Message *)0xf9981c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9988d);
    line = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    local_5f8 = line;
    message = (char *)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff8f0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    local_5f1 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8f0,
               (bool *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (type *)0xf998f5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffff95c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff950))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff910,line,message);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string(local_628);
      testing::Message::~Message((Message *)0xf999ca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf99a61);
    HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8ec);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff8f0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (type *)0xf99ac9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_638);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffff95c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff950))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffff910,line,message);
      testing::internal::AssertHelper::operator=(this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff990);
      testing::Message::~Message((Message *)0xf99b9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf99c32);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf99c3f);
    std::__cxx11::stringstream::~stringstream(local_2c8);
    google::
    HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf99c59);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}